

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall
capnp::DynamicStruct::Reader::Reader(Reader *this,StructSchema schema,OrphanBuilder *orphan)

{
  StructSize size;
  OrphanBuilder *orphan_local;
  Reader *this_local;
  StructSchema schema_local;
  
  (this->schema).super_Schema.raw = (RawBrandedSchema *)schema.super_Schema.raw;
  size = anon_unknown_70::structSizeFromSchema(schema);
  capnp::_::OrphanBuilder::asStructReader(&this->reader,orphan,size);
  return;
}

Assistant:

DynamicStruct::Reader::Reader(StructSchema schema, const _::OrphanBuilder& orphan)
    : schema(schema), reader(orphan.asStructReader(structSizeFromSchema(schema))) {}